

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::AddMakefile(cmGlobalGenerator *this,cmMakefile *mf)

{
  pointer *pppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  cmState *this_00;
  pointer ppcVar3;
  cmake *pcVar4;
  pointer ppcVar5;
  int iVar6;
  string *psVar7;
  float fVar8;
  float fVar9;
  string local_50;
  cmMakefile *local_30;
  
  __position._M_current =
       (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = mf;
  if (__position._M_current ==
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
              ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->Makefiles,__position,
               &local_30);
  }
  else {
    *__position._M_current = mf;
    pppcVar1 = &(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  IndexMakefile(this,local_30);
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_NUMBER_OF_MAKEFILES","");
  psVar7 = cmState::GetInitializedCacheValue(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (psVar7 == (string *)0x0) {
    fVar9 = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    fVar8 = 0.95;
    if (fVar9 <= 0.95) {
      fVar8 = fVar9;
    }
    this->FirstTimeProgress = fVar8;
    pcVar4 = this->CMakeInstance;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Configuring","");
    cmake::UpdateProgress(pcVar4,&local_50,this->FirstTimeProgress);
  }
  else {
    iVar6 = atoi((psVar7->_M_dataplus)._M_p);
    ppcVar3 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pcVar4 = this->CMakeInstance;
    ppcVar5 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Configuring","");
    fVar9 = ((float)(ulong)((long)ppcVar3 - (long)ppcVar5 >> 3) * 0.9) / (float)iVar6;
    fVar8 = 0.9;
    if (fVar9 <= 0.9) {
      fVar8 = fVar9;
    }
    cmake::UpdateProgress(pcVar4,&local_50,fVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddMakefile(cmMakefile* mf)
{
  this->Makefiles.push_back(mf);
  this->IndexMakefile(mf);

  // update progress
  // estimate how many lg there will be
  const std::string* numGenC =
    this->CMakeInstance->GetState()->GetInitializedCacheValue(
      "CMAKE_NUMBER_OF_MAKEFILES");

  if (!numGenC) {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move half way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) / 30.0f);
    if (this->FirstTimeProgress > 0.95f) {
      this->FirstTimeProgress = 0.95f;
    }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
    return;
  }

  int numGen = atoi(numGenC->c_str());
  float prog = 0.9f * static_cast<float>(this->Makefiles.size()) /
    static_cast<float>(numGen);
  if (prog > 0.9f) {
    prog = 0.9f;
  }
  this->CMakeInstance->UpdateProgress("Configuring", prog);
}